

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

wchar_t feat_order(wchar_t feat)

{
  wchar_t wVar1;
  
  wVar1 = f_info[feat].d_char;
  if (wVar1 < L':') {
    switch(wVar1) {
    case L' ':
      return L'\a';
    case L'#':
      return L'\x03';
    case L'%':
    case L'*':
      return L'\x04';
    case L'\'':
    case L'+':
      return L'\x01';
    case L'.':
      return L'\0';
    }
  }
  else {
    if ((uint)(wVar1 + L'\xffffffc6') < 2) {
      return L'\x05';
    }
    if ((wVar1 == L'<') || (wVar1 == L'>')) {
      return L'\x02';
    }
  }
  return L'\x06';
}

Assistant:

static int feat_order(int feat)
{
	struct feature *f = &f_info[feat];

	switch (f->d_char)
	{
		case L'.': 				return 0;
		case L'\'': case L'+': 	return 1;
		case L'<': case L'>':	return 2;
		case L'#':				return 3;
		case L'*': case L'%' :	return 4;
		case L';': case L':' :	return 5;
		case L' ':				return 7;
		default:
		{
			return 6;
		}
	}
}